

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O1

PrimitiveDisplayer * PrimitiveDisplayer::getInstance(void)

{
  PrimitiveDisplayer *pPVar1;
  Vec2d **ppVVar2;
  
  if (primitiveDisplayer == (PrimitiveDisplayer *)0x0) {
    pPVar1 = (PrimitiveDisplayer *)operator_new(0x10);
    pPVar1->pixelsPerSquare = 30.0;
    ppVVar2 = (Vec2d **)operator_new__(0x20);
    *ppVVar2 = Vec2d::ORIGIN;
    ppVVar2[1] = Vec2d::EAST;
    ppVVar2[2] = Vec2d::SOUTHEAST;
    ppVVar2[3] = Vec2d::SOUTH;
    pPVar1->verticesVec = ppVVar2;
    primitiveDisplayer = pPVar1;
  }
  return primitiveDisplayer;
}

Assistant:

PrimitiveDisplayer* PrimitiveDisplayer::getInstance() {
    if (primitiveDisplayer == nullptr) {
        primitiveDisplayer = new PrimitiveDisplayer(30);
    }
    return primitiveDisplayer;
}